

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

ssize_t libssh2_sftp_write(LIBSSH2_SFTP_HANDLE *hnd,char *buffer,size_t count)

{
  void **ppvVar1;
  LIBSSH2_SFTP *sftp;
  int iVar2;
  uint32_t uVar3;
  list_node *plVar4;
  list_node *plVar5;
  void *pvVar6;
  ssize_t sVar7;
  list_node *plVar8;
  char *pcVar9;
  LIBSSH2_SESSION *pLVar10;
  list_node *plVar11;
  size_t data_len;
  uchar *s;
  list_node *local_98;
  uchar *local_88;
  size_t local_80;
  list_head *local_78;
  LIBSSH2_SESSION *local_70;
  uchar *local_68;
  list_node *local_60;
  char *local_58;
  char *local_50;
  time_t local_48;
  LIBSSH2_CHANNEL *local_40;
  char *local_38;
  
  if (hnd == (LIBSSH2_SFTP_HANDLE *)0x0) {
    sVar7 = -0x27;
  }
  else {
    local_60 = (list_node *)count;
    local_50 = buffer;
    local_48 = time((time_t *)0x0);
    local_38 = hnd->handle;
    local_78 = &hnd->packet_list;
    do {
      sftp = hnd->sftp;
      local_40 = sftp->channel;
      local_70 = local_40->session;
      local_80 = 0;
      local_88 = (uchar *)0x0;
      if (sftp->write_state != libssh2_NB_state_sent) {
        sftp->last_errno = 0;
        plVar8 = (list_node *)
                 ((hnd->u).dir.next_name + ((long)(hnd->u).dir.names_packet - (hnd->u).file.offset))
        ;
        plVar4 = (list_node *)((long)local_60 - (long)plVar8);
        if (local_60 < plVar8) {
          plVar8 = (list_node *)0x0;
          plVar4 = (list_node *)0x0;
        }
        local_58 = local_50 + (long)&plVar8->next;
        sftp->write_state = libssh2_NB_state_idle;
        for (; pLVar10 = local_70, plVar4 != (list_node *)0x0;
            plVar4 = (list_node *)((long)plVar4 - (long)plVar8)) {
          plVar8 = (list_node *)0x7530;
          if (plVar4 < (list_node *)0x7530) {
            plVar8 = plVar4;
          }
          iVar2 = (int)hnd->handle_len + (int)plVar8;
          plVar11 = (list_node *)(ulong)(iVar2 + 0x19);
          plVar5 = (list_node *)(*local_70->alloc)((size_t)&plVar11[2].head,&local_70->abstract);
          if (plVar5 == (list_node *)0x0) {
            iVar2 = _libssh2_error(pLVar10,-6,"malloc fail for FXP_WRITE");
            local_98 = (list_node *)(long)iVar2;
            goto LAB_00126142;
          }
          plVar5[1].prev = plVar8;
          plVar5[1].head = (list_head *)0x0;
          plVar5[2].next = plVar11;
          local_68 = (uchar *)((long)&plVar5[2].prev + 4);
          _libssh2_store_u32(&local_68,iVar2 + 0x15);
          *local_68 = '\x06';
          uVar3 = sftp->request_id;
          sftp->request_id = uVar3 + 1;
          *(uint32_t *)&plVar5[2].prev = uVar3;
          local_68 = local_68 + 1;
          _libssh2_store_u32(&local_68,uVar3);
          _libssh2_store_str(&local_68,local_38,hnd->handle_len);
          _libssh2_store_u64(&local_68,(hnd->u).file.offset_sent);
          pcVar9 = local_58;
          ppvVar1 = &(hnd->u).dir.names_packet;
          *ppvVar1 = (void *)((long)&plVar8->next + (long)*ppvVar1);
          _libssh2_store_str(&local_68,local_58,(size_t)plVar8);
          _libssh2_list_add(local_78,plVar5);
          local_58 = pcVar9 + (long)plVar8;
        }
        for (plVar4 = (list_node *)_libssh2_list_first(local_78); plVar4 != (list_node *)0x0;
            plVar4 = (list_node *)_libssh2_list_next(plVar4)) {
          if (plVar4[2].next != (list_node *)0x0) {
            local_98 = (list_node *)
                       _libssh2_channel_write
                                 (local_40,0,
                                  (uchar *)((long)&plVar4[1].head[3].first +
                                           (long)((long)&plVar4->next + 4)),(size_t)plVar4[2].next);
            if ((long)local_98 < 0) goto LAB_00126142;
            plVar4[1].head = (list_head *)((long)&local_98->next + (long)&(plVar4[1].head)->last);
            plVar8 = plVar4 + 2;
            plVar8->next = (list_node *)((long)plVar8->next - (long)local_98);
            if (plVar8->next != (list_node *)0x0) break;
          }
        }
      }
      sftp->write_state = libssh2_NB_state_idle;
      plVar4 = (list_node *)_libssh2_list_first(local_78);
      if (plVar4 == (list_node *)0x0) {
        plVar8 = (list_node *)0x0;
      }
      else {
        plVar8 = (list_node *)0x0;
        do {
          if (plVar4[2].next != (list_node *)0x0 || plVar8 != (list_node *)0x0) break;
          iVar2 = sftp_packet_require(sftp,'e',*(uint32_t *)&plVar4[2].prev,&local_88,&local_80,9);
          pLVar10 = local_70;
          if (iVar2 == -0x26) {
            if (local_80 != 0) {
              (*local_70->free)(local_88,&local_70->abstract);
            }
            pcVar9 = "FXP write packet too short";
LAB_00126137:
            iVar2 = _libssh2_error(pLVar10,-0x1f,pcVar9);
            local_98 = (list_node *)(long)iVar2;
            goto LAB_00126142;
          }
          if (iVar2 < 0) {
            local_98 = (list_node *)(long)iVar2;
            if (iVar2 == -0x25) {
              sftp->write_state = libssh2_NB_state_sent;
            }
            goto LAB_00126142;
          }
          uVar3 = _libssh2_ntohu32(local_88 + 5);
          pLVar10 = local_70;
          (*local_70->free)(local_88,&local_70->abstract);
          sftp->last_errno = uVar3;
          if (uVar3 != 0) {
            sftp_packetlist_flush(hnd);
            pvVar6 = (void *)((hnd->u).file.offset - (hnd->u).file.acked);
            (hnd->u).file.offset = (libssh2_uint64_t)pvVar6;
            (hnd->u).dir.names_packet = pvVar6;
            (hnd->u).file.acked = 0;
            pcVar9 = "FXP write failed";
            goto LAB_00126137;
          }
          plVar8 = plVar4[1].prev;
          (hnd->u).file.offset = (long)&plVar8->next + (hnd->u).file.offset;
          plVar5 = (list_node *)_libssh2_list_next(plVar4);
          _libssh2_list_remove(plVar4);
          (*pLVar10->free)(plVar4,&pLVar10->abstract);
          plVar4 = plVar5;
        } while (plVar5 != (list_node *)0x0);
      }
      plVar4 = (list_node *)((long)&plVar8->next + (long)(hnd->u).dir.next_name);
      if (plVar4 == (list_node *)0x0) {
        local_98 = (list_node *)0x0;
      }
      else {
        local_98 = local_60;
        if (plVar4 < local_60) {
          local_98 = plVar4;
        }
        (hnd->u).dir.next_name = (char *)((long)plVar4 - (long)local_98);
      }
LAB_00126142:
      if (local_98 != (list_node *)0xffffffffffffffdb) {
        return (ssize_t)local_98;
      }
      pLVar10 = hnd->sftp->channel->session;
      if (pLVar10 == (LIBSSH2_SESSION *)0x0) {
        return -0x25;
      }
      if (pLVar10->api_block_mode == 0) {
        return -0x25;
      }
      iVar2 = _libssh2_wait_socket(pLVar10,local_48);
    } while (iVar2 == 0);
    sVar7 = (ssize_t)iVar2;
  }
  return sVar7;
}

Assistant:

static ssize_t sftp_write(LIBSSH2_SFTP_HANDLE *handle, const char *buffer,
                          size_t count)
{
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t data_len = 0;
    uint32_t retcode;
    uint32_t packet_len;
    unsigned char *s, *data = NULL;
    ssize_t rc;
    struct sftp_pipeline_chunk *chunk;
    struct sftp_pipeline_chunk *next;
    size_t acked = 0;
    size_t org_count = count;
    size_t already;

    switch(sftp->write_state) {
    default:
    case libssh2_NB_state_idle:
        sftp->last_errno = LIBSSH2_FX_OK;

        /* Number of bytes sent off that haven't been acked and therefore we
           will get passed in here again.

           Also, add up the number of bytes that actually already have been
           acked but we haven't been able to return as such yet, so we will
           get that data as well passed in here again.
        */
        already = (size_t)(handle->u.file.offset_sent -
                           handle->u.file.offset)+
            handle->u.file.acked;

        if(count >= already) {
            /* skip the part already made into packets */
            buffer += already;
            count -= already;
        }
        else
            /* there is more data already fine than what we got in this call */
            count = 0;

        sftp->write_state = libssh2_NB_state_idle;
        while(count) {
            /* TODO: Possibly this should have some logic to prevent a very
               very small fraction to be left but lets ignore that for now */
            uint32_t size =
                (uint32_t)(LIBSSH2_MIN(MAX_SFTP_OUTGOING_SIZE, count));
            uint32_t request_id;

            /* 25 = packet_len(4) + packet_type(1) + request_id(4) +
               handle_len(4) + offset(8) + count(4) */
            packet_len = (uint32_t)(handle->handle_len + size + 25);

            chunk = LIBSSH2_ALLOC(session, packet_len +
                                  sizeof(struct sftp_pipeline_chunk));
            if(!chunk)
                return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                      "malloc fail for FXP_WRITE");

            chunk->len = size;
            chunk->sent = 0;
            chunk->lefttosend = packet_len;

            s = chunk->packet;
            _libssh2_store_u32(&s, packet_len - 4);

            *(s++) = SSH_FXP_WRITE;
            request_id = sftp->request_id++;
            chunk->request_id = request_id;
            _libssh2_store_u32(&s, request_id);
            _libssh2_store_str(&s, handle->handle, handle->handle_len);
            _libssh2_store_u64(&s, handle->u.file.offset_sent);
            handle->u.file.offset_sent += size; /* advance offset at once */
            _libssh2_store_str(&s, buffer, size);

            /* add this new entry LAST in the list */
            _libssh2_list_add(&handle->packet_list, &chunk->node);

            buffer += size;
            count -= size; /* deduct the size we used, as we might have
                              to create more packets */
        }

        /* move through the WRITE packets that haven't been sent and send as
           many as possible - remember that we don't block */
        chunk = _libssh2_list_first(&handle->packet_list);

        while(chunk) {
            if(chunk->lefttosend) {
                rc = _libssh2_channel_write(channel, 0,
                                            &chunk->packet[chunk->sent],
                                            chunk->lefttosend);
                if(rc < 0)
                    /* remain in idle state */
                    return rc;

                /* remember where to continue sending the next time */
                chunk->lefttosend -= rc;
                chunk->sent += rc;

                if(chunk->lefttosend)
                    /* data left to send, get out of loop */
                    break;
            }

            /* move on to the next chunk with data to send */
            chunk = _libssh2_list_next(&chunk->node);
        }

        LIBSSH2_FALLTHROUGH();

    case libssh2_NB_state_sent:

        sftp->write_state = libssh2_NB_state_idle;
        /*
         * Count all ACKed packets
         */
        chunk = _libssh2_list_first(&handle->packet_list);

        while(chunk) {
            if(chunk->lefttosend)
                /* if the chunk still has data left to send, we shouldn't wait
                   for an ACK for it just yet */
                break;

            else if(acked)
                /* if we have sent data that is acked, we must return that
                   info before we call a function that might return EAGAIN */
                break;

            /* we check the packets in order */
            rc = sftp_packet_require(sftp, SSH_FXP_STATUS,
                                     chunk->request_id, &data, &data_len, 9);
            if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
                if(data_len > 0) {
                    LIBSSH2_FREE(session, data);
                }
                return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                      "FXP write packet too short");
            }
            else if(rc < 0) {
                if(rc == LIBSSH2_ERROR_EAGAIN)
                    sftp->write_state = libssh2_NB_state_sent;
                return rc;
            }

            retcode = _libssh2_ntohu32(data + 5);
            LIBSSH2_FREE(session, data);

            sftp->last_errno = retcode;
            if(retcode == LIBSSH2_FX_OK) {
                acked += chunk->len; /* number of payload data that was acked
                                        here */

                /* we increase the offset value for all acks */
                handle->u.file.offset += chunk->len;

                next = _libssh2_list_next(&chunk->node);

                _libssh2_list_remove(&chunk->node); /* remove from list */
                LIBSSH2_FREE(session, chunk); /* free memory */

                chunk = next;
            }
            else {
                /* flush all pending packets from the outgoing list */
                sftp_packetlist_flush(handle);

                /* since we return error now, the application will not get any
                   outstanding data acked, so we need to rewind the offset to
                   where the application knows it has reached with acked
                   data */
                handle->u.file.offset -= handle->u.file.acked;

                /* then reset the offset_sent to be the same as the offset */
                handle->u.file.offset_sent = handle->u.file.offset;

                /* clear the acked counter since we can have no pending data to
                   ack after an error */
                handle->u.file.acked = 0;

                /* the server returned an error for that written chunk,
                   propagate this back to our parent function */
                return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                      "FXP write failed");
            }
        }
        break;
    }

    /* if there were acked data in a previous call that wasn't returned then,
       add that up and try to return it all now. This can happen if the app
       first sends a huge buffer of data, and then in a second call it sends a
       smaller one. */
    acked += handle->u.file.acked;

    if(acked) {
        ssize_t ret = LIBSSH2_MIN(acked, org_count);
        /* we got data acked so return that amount, but no more than what
           was asked to get sent! */

        /* store the remainder. 'ret' is always equal to or less than 'acked'
           here */
        handle->u.file.acked = acked - ret;

        return ret;
    }

    else
        return 0; /* nothing was acked, and no EAGAIN was received! */
}